

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void finish_pass_huff(j_compress_ptr cinfo)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  boolean bVar6;
  long *in_RDI;
  working_state state;
  huff_entropy_ptr entropy;
  working_state *state_00;
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  undefined8 uVar7;
  
  lVar1 = in_RDI[0x46];
  if ((int)in_RDI[0x2b] == 0) {
    state_00 = *(working_state **)in_RDI[5];
    uVar7 = *(undefined8 *)(in_RDI[5] + 8);
    uVar2 = *(undefined8 *)(lVar1 + 0x18);
    uVar3 = *(undefined8 *)(lVar1 + 0x20);
    uVar4 = *(undefined8 *)(lVar1 + 0x28);
    uVar5 = *(undefined8 *)(lVar1 + 0x30);
    bVar6 = flush_bits_s(state_00);
    if (bVar6 == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x19;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(working_state **)in_RDI[5] = state_00;
    *(undefined8 *)(in_RDI[5] + 8) = uVar7;
    *(undefined8 *)(lVar1 + 0x18) = uVar2;
    *(undefined8 *)(lVar1 + 0x20) = uVar3;
    *(undefined8 *)(lVar1 + 0x28) = uVar4;
    *(undefined8 *)(lVar1 + 0x30) = uVar5;
  }
  else {
    *(undefined8 *)(lVar1 + 200) = *(undefined8 *)in_RDI[5];
    *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(in_RDI[5] + 8);
    emit_eobrun(in_stack_ffffffffffffffc0);
    flush_bits_e((huff_entropy_ptr)0x2960fd);
    *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar1 + 200);
    *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar1 + 0xd0);
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_huff (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;

  if (cinfo->progressive_mode) {
    entropy->next_output_byte = cinfo->dest->next_output_byte;
    entropy->free_in_buffer = cinfo->dest->free_in_buffer;

    /* Flush out any buffered data */
    emit_eobrun(entropy);
    flush_bits_e(entropy);

    cinfo->dest->next_output_byte = entropy->next_output_byte;
    cinfo->dest->free_in_buffer = entropy->free_in_buffer;
  } else {
    /* Load up working state ... flush_bits needs it */
    state.next_output_byte = cinfo->dest->next_output_byte;
    state.free_in_buffer = cinfo->dest->free_in_buffer;
    ASSIGN_STATE(state.cur, entropy->saved);
    state.cinfo = cinfo;

    /* Flush out the last data */
    if (! flush_bits_s(&state))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);

    /* Update state */
    cinfo->dest->next_output_byte = state.next_output_byte;
    cinfo->dest->free_in_buffer = state.free_in_buffer;
    ASSIGN_STATE(entropy->saved, state.cur);
  }
}